

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.cpp
# Opt level: O0

bool anon_unknown.dwarf_2c124::unserialize_vector<char>
               (char *objs,int32_t n,char *bufferData,size_t bufferSize,size_t *offset,
               Unserialize *op)

{
  char *__result;
  char *pcVar1;
  char *in_RCX;
  int in_ESI;
  size_t *in_R8;
  Unserialize *in_R9;
  unsigned_long osize;
  
  __result = (char *)(long)in_ESI;
  pcVar1 = __result + *in_R8;
  if (pcVar1 <= in_RCX) {
    std::copy<char_const*,char*>((char *)in_R8,(char *)in_R9,__result);
    advance<GGSock::Unserialize>(in_R8,(size_t)__result,in_R9);
  }
  return pcVar1 <= in_RCX;
}

Assistant:

inline bool unserialize_vector(T * objs, int32_t n, const char * bufferData, size_t bufferSize, size_t & offset, GGSock::Unserialize & op) noexcept {
            static_assert(std::is_fundamental<T>::value, "Fundamental type required");

            auto osize = sizeof(T)*n;

            if (offset + osize > bufferSize) {
                return false;
            }

            std::copy(
                bufferData + offset,
                bufferData + offset + osize, reinterpret_cast<char *>(objs));

            ::advance(offset, osize, op);

            return true;
        }